

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleighbase.hh
# Opt level: O3

void __thiscall SleighBase::~SleighBase(SleighBase *this)

{
  pointer pFVar1;
  
  (this->super_Translate).super_AddrSpaceManager._vptr_AddrSpaceManager =
       (_func_int **)&PTR__SleighBase_003cd488;
  SymbolTable::~SymbolTable(&this->symtab);
  std::
  _Rb_tree<VarnodeData,_std::pair<const_VarnodeData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_VarnodeData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<VarnodeData>,_std::allocator<std::pair<const_VarnodeData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->varnode_xref)._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->userop);
  (this->super_Translate).super_AddrSpaceManager._vptr_AddrSpaceManager =
       (_func_int **)&PTR__Translate_003bda90;
  pFVar1 = (this->super_Translate).floatformats.
           super__Vector_base<FloatFormat,_std::allocator<FloatFormat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar1 != (pointer)0x0) {
    operator_delete(pFVar1);
  }
  AddrSpaceManager::~AddrSpaceManager((AddrSpaceManager *)this);
  return;
}

Assistant:

bool isInitialized(void) const { return (root != (SubtableSymbol *)0); }